

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathCacheFreeObjectList(xmlPointerListPtr list)

{
  void **ppvVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  
  for (lVar4 = 0; ppvVar1 = list->items, lVar4 < list->number; lVar4 = lVar4 + 1) {
    pvVar2 = ppvVar1[lVar4];
    pvVar3 = *(void **)((long)pvVar2 + 8);
    if (pvVar3 != (void *)0x0) {
      if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
        (*xmlFree)(*(void **)((long)pvVar3 + 8));
        pvVar3 = *(void **)((long)pvVar2 + 8);
      }
      (*xmlFree)(pvVar3);
    }
    (*xmlFree)(pvVar2);
  }
  if (ppvVar1 != (void **)0x0) {
    (*xmlFree)(ppvVar1);
  }
  (*xmlFree)(list);
  return;
}

Assistant:

static void
xmlXPathCacheFreeObjectList(xmlPointerListPtr list)
{
    int i;
    xmlXPathObjectPtr obj;

    if (list == NULL)
	return;

    for (i = 0; i < list->number; i++) {
	obj = list->items[i];
	/*
	* Note that it is already assured that we don't need to
	* look out for namespace nodes in the node-set.
	*/
	if (obj->nodesetval != NULL) {
	    if (obj->nodesetval->nodeTab != NULL)
		xmlFree(obj->nodesetval->nodeTab);
	    xmlFree(obj->nodesetval);
	}
	xmlFree(obj);
#ifdef XP_DEBUG_OBJ_USAGE
	xmlXPathDebugObjCounterAll--;
#endif
    }
    xmlPointerListFree(list);
}